

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Bmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  Bmc_AndPar_t *pPars;
  char *pcVar4;
  Bmc_AndPar_t Pars;
  Bmc_AndPar_t local_98;
  Abc_Frame_t *local_38;
  
  local_98.nStart = 0;
  local_98.nFramesMax = 0;
  local_98.fUseGlucose = 0;
  local_98._76_4_ = 0;
  local_98.fUseEliminate = 0;
  local_98.pFuncOnFrameDone = (_func_void_int_int_int *)0x0;
  local_98.nFramesAdd = 0x32;
  local_98.nConfLimit = 0;
  local_98.nTimeOut = 0;
  local_98.nLutSize = 6;
  local_98.nProcs = 1;
  local_98.fLoadCnf = 0;
  local_98.fDumpFrames = 0;
  local_98.fUseSynth = 0;
  local_98.fUseOldCnf = 0;
  local_98.fVerbose = 0;
  local_98.fVeryVerbose = 0;
  local_98.fNotVerbose = 0;
  local_98.iFrame = 0;
  local_98.nFailOuts = 0;
  local_98.nDropOuts = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"SFATKdscvwh"), pAbc_00 = local_38,
          iVar2 = globalUtilOptind, 0x62 < iVar1) {
      if (iVar1 < 0x73) {
        if (iVar1 == 99) {
          local_98.fUseOldCnf = local_98.fUseOldCnf ^ 1;
        }
        else {
          if (iVar1 != 100) goto LAB_0028a767;
          local_98.fDumpFrames = local_98.fDumpFrames ^ 1;
        }
      }
      else if (iVar1 == 0x73) {
        local_98.fUseSynth = local_98.fUseSynth ^ 1;
      }
      else if (iVar1 == 0x76) {
        local_98.fVerbose = local_98.fVerbose ^ 1;
      }
      else {
        if (iVar1 != 0x77) goto LAB_0028a767;
        local_98.fVeryVerbose = local_98.fVeryVerbose ^ 1;
      }
    }
    if (iVar1 < 0x4b) {
      if (iVar1 == 0x41) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
          goto LAB_0028a758;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        local_98.nFramesAdd = iVar1;
      }
      else {
        if (iVar1 != 0x46) {
          if (iVar1 == -1) {
            if (local_38->pGia != (Gia_Man_t *)0x0) {
              iVar2 = Gia_ManBmcPerform(local_38->pGia,&local_98);
              pAbc_00->Status = iVar2;
              pAbc_00->nFrames = local_98.iFrame;
              Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
              return 0;
            }
            Abc_Print(-1,"Abc_CommandAbc9Bmc(): There is no AIG.\n");
            return 0;
          }
          goto LAB_0028a767;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_0028a758;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        local_98.nFramesMax = iVar1;
      }
    }
    else if (iVar1 == 0x4b) {
      if (argc <= globalUtilOptind) goto LAB_0028a758;
      iVar1 = atoi(argv[globalUtilOptind]);
      local_98.nLutSize = iVar1;
    }
    else if (iVar1 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0028a758;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      local_98.nStart = iVar1;
    }
    else {
      if (iVar1 != 0x54) goto LAB_0028a767;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_0028a758:
        Abc_Print(-1,pcVar4);
        goto LAB_0028a767;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      local_98.nTimeOut = iVar1;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
LAB_0028a767:
      Abc_Print(-2,"usage: &bmc [-SFATK num] [-dscvwh]\n");
      Abc_Print(-2,"\t         performs bounded model checking\n");
      Abc_Print(-2,"\t-S num : the starting timeframe [default = %d]\n",local_98._0_8_ & 0xffffffff)
      ;
      Abc_Print(-2,"\t-F num : the maximum number of timeframes [default = %d]\n",
                (ulong)local_98._0_8_ >> 0x20);
      Abc_Print(-2,"\t-A num : the number of additional frames to unroll [default = %d]\n",
                local_98._8_8_ & 0xffffffff);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",
                local_98._16_8_ & 0xffffffff);
      Abc_Print(-2,"\t-K num : the maximum cut size for CNF computation [default = %d]\n",
                (ulong)local_98._16_8_ >> 0x20);
      pcVar3 = "yes";
      pcVar4 = "yes";
      if (local_98.fDumpFrames == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dumping unfolded timeframes [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_98.fUseSynth == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing unrolled timeframes [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_98.fUseOldCnf == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using old CNF computation [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_98.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      if (local_98.fVeryVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing information about unfolding [default = %s]\n",pcVar3)
      ;
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Bmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Bmc_AndPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_AndPar_t) );
    pPars->nStart        =    0;  // starting timeframe
    pPars->nFramesMax    =    0;  // maximum number of timeframes
    pPars->nFramesAdd    =   50;  // the number of additional frames
    pPars->nConfLimit    =    0;  // maximum number of conflicts at a node
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->nLutSize      =    6;  // max LUT size for CNF computation
    pPars->nProcs        =    1;  // the number of parallel solvers
    pPars->fLoadCnf      =    0;  // dynamic CNF loading
    pPars->fDumpFrames   =    0;  // dump unrolled timeframes
    pPars->fUseSynth     =    0;  // use synthesis
    pPars->fUseOldCnf    =    0;  // use old CNF construction
    pPars->fVerbose      =    0;  // verbose
    pPars->fVeryVerbose  =    0;  // very verbose
    pPars->fNotVerbose   =    0;  // skip line-by-line print-out
    pPars->iFrame        =    0;  // explored up to this frame
    pPars->nFailOuts     =    0;  // the number of failed outputs
    pPars->nDropOuts     =    0;  // the number of dropped outputs
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SFATKdscvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAdd < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fDumpFrames ^= 1;
            break;
        case 's':
            pPars->fUseSynth ^= 1;
            break;
        case 'c':
            pPars->fUseOldCnf ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmc(): There is no AIG.\n" );
        return 0;
    }
    pAbc->Status  = Gia_ManBmcPerform( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmc [-SFATK num] [-dscvwh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking\n" );
    Abc_Print( -2, "\t-S num : the starting timeframe [default = %d]\n",                      pPars->nStart );
    Abc_Print( -2, "\t-F num : the maximum number of timeframes [default = %d]\n",            pPars->nFramesMax );
    Abc_Print( -2, "\t-A num : the number of additional frames to unroll [default = %d]\n",   pPars->nFramesAdd );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-K num : the maximum cut size for CNF computation [default = %d]\n",    pPars->nLutSize );
    Abc_Print( -2, "\t-d     : toggle dumping unfolded timeframes [default = %s]\n",          pPars->fDumpFrames?  "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle synthesizing unrolled timeframes [default = %s]\n",     pPars->fUseSynth?    "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using old CNF computation [default = %s]\n",            pPars->fUseOldCnf?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing information about unfolding [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}